

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmrc.hpp
# Opt level: O1

int __thiscall
cmrc::embedded_filesystem::open(embedded_filesystem *this,char *__file,int __oflag,...)

{
  file_or_directory *pfVar1;
  system_error *this_00;
  error_category *peVar2;
  error_code __ec;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,*(long *)__file,*(long *)(__file + 8) + *(long *)__file);
  pfVar1 = _get(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((pfVar1 != (file_or_directory *)0x0) && (pfVar1->_is_file != false)) {
    return (int)((pfVar1->_data).file_data)->begin_ptr;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  peVar2 = (error_category *)std::_V2::generic_category();
  __ec._M_cat = peVar2;
  __ec._0_8_ = 2;
  std::system_error::system_error(this_00,__ec,(string *)__file);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

file open(const std::string& path) const {
        auto entry_ptr = _get(path);
        if (!entry_ptr || !entry_ptr->is_file()) {
#ifdef CMRC_NO_EXCEPTIONS
            fprintf(stderr, "Error no such file or directory: %s\n", path.c_str());
            abort();
#else
            throw std::system_error(make_error_code(std::errc::no_such_file_or_directory), path);
#endif
        }
        auto& dat = entry_ptr->as_file();
        return file{dat.begin_ptr, dat.end_ptr};
    }